

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall
cmdline::parser::option_without_value::~option_without_value(option_without_value *this)

{
  option_without_value *in_RDI;
  
  ~option_without_value(in_RDI);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

~option_without_value() {}